

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O0

void __thiscall icu_63::Norms::enumRanges(Norms *this,Enumerator *e)

{
  uint32_t local_24;
  uint local_20;
  uint32_t i;
  UChar32 end;
  UChar32 start;
  Enumerator *e_local;
  Norms *this_local;
  
  i = 0;
  _end = e;
  e_local = (Enumerator *)this;
  while( true ) {
    local_20 = umutablecptrie_getRange_63
                         (this->normTrie,i,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                          (void *)0x0,&local_24);
    if ((int)local_20 < 0) break;
    if (local_24 != 0) {
      (*_end->_vptr_Enumerator[2])(_end,(ulong)i,(ulong)local_20);
    }
    i = local_20 + 1;
  }
  return;
}

Assistant:

void Norms::enumRanges(Enumerator &e) {
    UChar32 start = 0, end;
    uint32_t i;
    while ((end = umutablecptrie_getRange(normTrie, start, UCPMAP_RANGE_NORMAL, 0,
                                          nullptr, nullptr, &i)) >= 0) {
        if (i > 0) {
            e.rangeHandler(start, end, norms[i]);
        }
        start = end + 1;
    }
}